

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QGenericArrayOps<QCss::StyleSheet>::copyAppend
          (QGenericArrayOps<QCss::StyleSheet> *this,StyleSheet *b,StyleSheet *e)

{
  StyleSheet *this_00;
  ulong in_RDX;
  ulong in_RSI;
  StyleSheet *in_RDI;
  StyleSheet *data;
  ulong local_10;
  
  if (in_RSI != in_RDX) {
    this_00 = QArrayDataPointer<QCss::StyleSheet>::begin
                        ((QArrayDataPointer<QCss::StyleSheet> *)0x86b1b7);
    local_10 = in_RSI;
    while (local_10 < in_RDX) {
      QCss::StyleSheet::StyleSheet(this_00,in_RDI);
      local_10 = local_10 + 0xa0;
      (in_RDI->styleRules).d.size = (in_RDI->styleRules).d.size + 1;
    }
  }
  return;
}

Assistant:

void copyAppend(const T *b, const T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e) // short-cut and handling the case b and e == nullptr
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(*b);
            ++b;
            ++this->size;
        }
    }